

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diag.cpp
# Opt level: O1

int __thiscall ncnn::Diag::forward(Diag *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  void *pvVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  
  if (bottom_blob->dims == 2) {
    uVar1 = bottom_blob->w;
    uVar3 = bottom_blob->h;
    uVar11 = uVar1 - uVar3;
    uVar13 = (int)uVar11 >> 0x1f & uVar11;
    uVar8 = 0;
    if (0 < (int)uVar11) {
      uVar8 = uVar11;
    }
    iVar7 = this->diagonal;
    if (iVar7 < (int)uVar13 || (int)uVar8 < iVar7) {
      if ((iVar7 == -uVar3 || SBORROW4(iVar7,-uVar3) != (int)(iVar7 + uVar3) < 0) ||
          (int)uVar13 <= iVar7) {
        uVar11 = 0;
        if ((int)uVar8 < iVar7) {
          uVar11 = uVar1 - iVar7;
          if (uVar1 - iVar7 == 0 || (int)uVar1 < iVar7) {
            uVar11 = 0;
          }
        }
      }
      else {
        uVar11 = iVar7 + uVar3;
      }
    }
    else {
      uVar11 = uVar1;
      if ((int)uVar3 < (int)uVar1) {
        uVar11 = uVar3;
      }
    }
    Mat::create(top_blob,uVar11,bottom_blob->elemsize,opt->blob_allocator);
    pvVar10 = top_blob->data;
    if (pvVar10 == (void *)0x0) {
      bVar14 = true;
    }
    else {
      bVar14 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar14) {
      iVar7 = -100;
      if (uVar11 == 0) {
        iVar7 = 0;
      }
    }
    else {
      iVar7 = -100;
      if (0 < (int)uVar11) {
        uVar1 = this->diagonal;
        uVar12 = 0;
        uVar5 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar5 = uVar12;
        }
        iVar4 = bottom_blob->w;
        pvVar6 = (void *)(uVar5 * 4 + (long)bottom_blob->data);
        sVar2 = bottom_blob->elemsize;
        iVar9 = -((int)uVar1 >> 0x1f & uVar1);
        do {
          *(undefined4 *)((long)pvVar10 + uVar12 * 4) =
               *(undefined4 *)((long)pvVar6 + (long)iVar4 * sVar2 * (long)iVar9);
          uVar12 = uVar12 + 1;
          pvVar6 = (void *)((long)pvVar6 + 4);
          iVar9 = iVar9 + 1;
        } while (uVar11 != uVar12);
      }
    }
    if (bVar14) {
      return iVar7;
    }
  }
  else if (bottom_blob->dims == 1) {
    uVar1 = bottom_blob->w;
    iVar7 = this->diagonal;
    iVar4 = -iVar7;
    if (0 < iVar7) {
      iVar4 = iVar7;
    }
    Mat::create(top_blob,iVar4 + uVar1,iVar4 + uVar1,bottom_blob->elemsize,opt->blob_allocator);
    pvVar10 = top_blob->data;
    if (pvVar10 == (void *)0x0) {
      bVar14 = true;
    }
    else {
      bVar14 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar14) {
      return -100;
    }
    uVar3 = top_blob->c * (int)top_blob->cstep;
    if (0 < (int)uVar3) {
      memset(pvVar10,0,(ulong)uVar3 << 2);
    }
    if (0 < (int)uVar1) {
      uVar3 = this->diagonal;
      uVar12 = 0;
      uVar5 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar5 = uVar12;
      }
      pvVar6 = bottom_blob->data;
      iVar7 = top_blob->w;
      pvVar10 = (void *)((long)pvVar10 + uVar5 * 4);
      sVar2 = top_blob->elemsize;
      iVar4 = -((int)uVar3 >> 0x1f & uVar3);
      do {
        *(undefined4 *)((long)pvVar10 + (long)iVar7 * sVar2 * (long)iVar4) =
             *(undefined4 *)((long)pvVar6 + uVar12 * 4);
        uVar12 = uVar12 + 1;
        pvVar10 = (void *)((long)pvVar10 + 4);
        iVar4 = iVar4 + 1;
      } while (uVar1 != uVar12);
    }
    if (bVar14) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Diag::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 1)
    {
        int w = bottom_blob.w;
        int top_w = w + ((diagonal >= 0) ? diagonal : -diagonal);

        top_blob.create(top_w, top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.fill(0.0f);

        int bias_r = -std::min(diagonal, 0);
        int bias_c = std::max(diagonal, 0);

        for (int i = 0; i < w; i++)
        {
            top_blob.row(i + bias_r)[i + bias_c] = bottom_blob[i];
        }
    }
    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int len = 0;
        int minimum = std::min(w - h, 0);
        int maximum = std::max(w - h, 0);
        if (diagonal <= maximum && diagonal >= minimum)
            len = std::min(w, h);
        else if (diagonal > -h && diagonal < minimum)
            len = diagonal + h;
        else if (diagonal > maximum && diagonal < w)
            len = -diagonal + w;

        top_blob.create(len, elemsize, opt.blob_allocator);
        if (top_blob.empty())
        {
            if (len == 0)
                return 0;
            return -100;
        }

        int bias_r = -std::min(diagonal, 0);
        int bias_c = std::max(diagonal, 0);

        for (int i = 0; i < len; i++)
        {
            top_blob[i] = bottom_blob.row(i + bias_r)[i + bias_c];
        }
    }

    return 0;
}